

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_filter_program_signature.c
# Opt level: O3

void test_read_filter_program_signature(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  char *fmt;
  archive_entry *ae;
  archive_entry *local_38;
  
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                   ,L'0',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_program(paVar3,"nonexistent");
  if (iVar1 == -0x1e) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                   ,L'3');
    fmt = "archive_read_support_filter_program() unsupported on this platform";
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                        ,L'7',0,"ARCHIVE_OK",(long)iVar1,"r",paVar3);
    iVar1 = archive_read_support_format_all(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                        ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3
                       );
    iVar1 = archive_read_open_memory(paVar3,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                        ,L';',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                        "archive_read_open_memory(a, archive, sizeof(archive))",paVar3);
    iVar1 = archive_read_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                        ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
    iVar1 = archive_read_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                        ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    wVar2 = canGzip();
    if (wVar2 != L'\0') {
      paVar3 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                       ,L'F',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_filter_none(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'H',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_none(a)",
                          paVar3);
      iVar1 = archive_read_support_filter_program_signature(paVar3,"gzip -d",archive,4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'K',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_support_filter_program_signature(a, \"gzip -d\", signature, signature_len)"
                          ,paVar3);
      iVar1 = archive_read_support_format_all(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar3);
      iVar1 = archive_read_open_memory(paVar3,archive,0x5d);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'O',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_open_memory(a, archive, sizeof(archive))",paVar3);
      iVar1 = archive_read_next_header(paVar3,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'Q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3
                         );
      iVar1 = archive_filter_code(paVar3,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'R',(long)iVar1,"archive_filter_code(a, 0)",4,"ARCHIVE_FILTER_PROGRAM",
                          (void *)0x0);
      iVar1 = archive_format(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'S',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                          (void *)0x0);
      iVar1 = archive_read_close(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'T',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
      iVar1 = archive_read_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar3 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                       ,L'Z',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_filter_none(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'\\',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_none(a)",
                          paVar3);
      iVar1 = archive_read_support_filter_program_signature(paVar3,"gunzip",archive + 1,4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'_',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_support_filter_program_signature(a, \"gunzip\", badsignature, signature_len)"
                          ,paVar3);
      iVar1 = archive_read_support_format_all(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar3);
      iVar1 = archive_read_open_memory(paVar3,archive,0x5d);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'c',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                          "archive_read_open_memory(a, archive, sizeof(archive))",paVar3);
      iVar1 = archive_read_close(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'd',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
      iVar1 = archive_read_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                          ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      return;
    }
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_program_signature.c"
                   ,L'C');
    fmt = "Can\'t run gzip program on this platform";
  }
  test_skipping(fmt);
  return;
}

Assistant:

DEFINE_TEST(test_read_filter_program_signature)
{
	int r;
	struct archive_entry *ae;
	struct archive *a;

	/*
	 * First, test handling when a non-existent compression
	 * program is requested.
	 */
	assert((a = archive_read_new()) != NULL);
	r = archive_read_support_filter_program(a, "nonexistent");
	if (r == ARCHIVE_FATAL) {
		skipping("archive_read_support_filter_program() "
		    "unsupported on this platform");
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, r);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_FATAL,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * If we have "gzip -d", try using that.
	 */
	if (!canGzip()) {
		skipping("Can't run gzip program on this platform");
		return;
	}
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_program_signature(a, "gzip -d",
		signature, signature_len));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_PROGRAM);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test bad signature.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_program_signature(a, "gunzip",
		badsignature, signature_len));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_FATAL,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}